

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

void __thiscall TiXmlAttributeSet::Remove(TiXmlAttributeSet *this,TiXmlAttribute *removeMe)

{
  TiXmlAttribute *pTVar1;
  TiXmlAttribute *pTVar2;
  
  pTVar2 = &this->sentinel;
  do {
    pTVar2 = pTVar2->next;
    if (pTVar2 == &this->sentinel) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                    ,0x608,"void TiXmlAttributeSet::Remove(TiXmlAttribute *)");
    }
  } while (pTVar2 != removeMe);
  pTVar1 = pTVar2->prev;
  pTVar1->next = pTVar2->next;
  pTVar2->next->prev = pTVar1;
  pTVar2->prev = (TiXmlAttribute *)0x0;
  pTVar2->next = (TiXmlAttribute *)0x0;
  return;
}

Assistant:

void TiXmlAttributeSet::Remove( TiXmlAttribute* removeMe )
{
	TiXmlAttribute* node;

	for( node = sentinel.next; node != &sentinel; node = node->next )
	{
		if ( node == removeMe )
		{
			node->prev->next = node->next;
			node->next->prev = node->prev;
			node->next = 0;
			node->prev = 0;
			return;
		}
	}
	assert( 0 );		// we tried to remove a non-linked attribute.
}